

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewClass::Update(DataViewClass *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  String *class_name_00;
  Element *element_00;
  DataExpression *this_00;
  undefined1 local_80 [6];
  bool is_set;
  bool activate;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  String *class_name;
  DataModel *model_local;
  DataViewClass *this_local;
  
  class_name_00 = DataViewCommon::GetModifier_abi_cxx11_(&this->super_DataViewCommon);
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)local_80,model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)local_80,(Variant *)&element);
    if (bVar2) {
      bVar2 = Variant::Get<bool>((Variant *)&element,false);
      bVar3 = Element::IsClassSet(element_00,class_name_00);
      if (bVar2 != bVar3) {
        Element::SetClass(element_00,class_name_00,bVar2);
        variant.data[0x1f] = '\x01';
      }
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewClass::Update(DataModel& model)
{
	const String& class_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool activate = variant.Get<bool>();
		const bool is_set = element->IsClassSet(class_name);
		if (activate != is_set)
		{
			element->SetClass(class_name, activate);
			result = true;
		}
	}
	return result;
}